

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

Abc_ManTime_t * Abc_ManTimeStart(Abc_Ntk_t *pNtk)

{
  float fVar1;
  Abc_ManTime_t *p;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  
  p = (Abc_ManTime_t *)calloc(1,0x40);
  pNtk->pManTime = p;
  pVVar2 = Vec_PtrAlloc(0);
  p->vArrs = pVVar2;
  pVVar2 = Vec_PtrAlloc(0);
  p->vReqs = pVVar2;
  (p->tReqDef).Rise = 0.0;
  (p->tReqDef).Fall = 0.0;
  Abc_ManTimeExpand(p,pNtk->vObjs->nSize + 1,0);
  for (iVar4 = 0; iVar4 < pNtk->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar4);
    fVar1 = (p->tArrDef).Rise;
    Abc_NtkTimeSetArrival(pNtk,pAVar3->Id,fVar1,fVar1);
  }
  for (iVar4 = 0; iVar4 < pNtk->vCos->nSize; iVar4 = iVar4 + 1) {
    pAVar3 = Abc_NtkCo(pNtk,iVar4);
    fVar1 = (p->tReqDef).Rise;
    Abc_NtkTimeSetRequired(pNtk,pAVar3->Id,fVar1,fVar1);
  }
  return p;
}

Assistant:

Abc_ManTime_t * Abc_ManTimeStart( Abc_Ntk_t * pNtk )
{
    int fUseZeroDefaultOutputRequired = 1;
    Abc_ManTime_t * p;
    Abc_Obj_t * pObj; int i;
    p = pNtk->pManTime = ABC_ALLOC( Abc_ManTime_t, 1 );
    memset( p, 0, sizeof(Abc_ManTime_t) );
    p->vArrs = Vec_PtrAlloc( 0 );
    p->vReqs = Vec_PtrAlloc( 0 );
    // set default default input=arrivals (assumed to be 0)
    // set default default output-requireds (can be either 0 or +infinity, based on the flag)
    p->tReqDef.Rise = fUseZeroDefaultOutputRequired ? 0 : ABC_INFINITY;
    p->tReqDef.Fall = fUseZeroDefaultOutputRequired ? 0 : ABC_INFINITY;
    // extend manager
    Abc_ManTimeExpand( p, Abc_NtkObjNumMax(pNtk) + 1, 0 );
    // set the default timing for CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), p->tArrDef.Rise, p->tArrDef.Rise );   
    // set the default timing for COs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), p->tReqDef.Rise, p->tReqDef.Rise );        
    return p;
}